

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_Interval::Includes(ON_Interval *this,ON_Interval *other,bool bProperSubSet)

{
  double t;
  bool bVar1;
  bool bVar2;
  
  t = other->m_t[0];
  bVar2 = false;
  bVar1 = Includes(this,t,false);
  if (bVar1) {
    bVar2 = Includes(this,other->m_t[1],false);
  }
  if ((bProperSubSet & bVar2) == 1) {
    bVar1 = Includes(this,t,true);
    if (!bVar1) {
      bVar1 = Includes(this,other->m_t[1],true);
      bVar2 = (bool)(bVar2 & bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool
ON_Interval::Includes( const ON_Interval& other, bool bProperSubSet ) const
{
  bool rc = ( Includes( other.m_t[0] ) && Includes( other.m_t[1] ) ) ? true : false;
  if ( rc && bProperSubSet )
  {
    if ( !Includes( other.m_t[0], true ) && !Includes( other.m_t[1], true ) )
      rc = false;
  }
  return rc;
}